

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall serialize_tests::with_params_move::test_method(with_params_move *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  Base base2;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  Base base1;
  lazy_ostream local_180;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  pstream;
  UncopyableStream stream;
  undefined **local_e8;
  undefined4 *local_e0;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_d8;
  size_type local_c0;
  undefined **local_b8;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_b0;
  size_type local_98;
  undefined1 local_90 [24];
  assertion_result local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 3;
  sp.m_data = (byte *)0xf77dfb;
  DataStream::DataStream(&stream.super_DataStream,sp);
  pbVar3 = stream.super_DataStream.vch.
           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pbVar2 = stream.super_DataStream.vch.
           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar1 = stream.super_DataStream.vch.
           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = (undefined **)&RAW;
  stream.super_DataStream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stream.super_DataStream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stream.super_DataStream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = stream.super_DataStream.m_read_pos;
  local_e8 = (undefined **)&HEX;
  local_e0 = &RAW;
  local_b0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = stream.super_DataStream.m_read_pos;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_b0);
  pstream.m_params = (BaseFormat *)&RAW;
  pstream.m_substream.m_params = (BaseFormat *)&HEX;
  pstream.m_substream.m_substream.m_params = (BaseFormat *)&RAW;
  pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = pbVar1;
  pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar2;
  pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pbVar3;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos =
       stream.super_DataStream.m_read_pos;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_d8);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1a1;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,pbVar1 + stream.super_DataStream.m_read_pos,pbVar2);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"abc");
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_90._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_60;
  local_e0 = (undefined4 *)((ulong)local_e0 & 0xffffffffffffff00);
  local_e8 = &PTR__lazy_ostream_013ae148;
  local_d8._M_impl.super__Vector_impl_data._M_start = boost::unit_test::lazy_ostream::inst;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage = local_90;
  local_90._0_8_ = "abc";
  local_b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b0._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_b8 = &PTR__lazy_ostream_013ae898;
  local_b0._M_impl.super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_60 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_180,1,2,REQUIRE,0xf10899,(size_t)(local_90 + 8),0x1a1,&local_e8,
             "\"abc\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos = 0;
  base1.m_base_data = ' ';
  Base::
  Serialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base1,&pstream);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1a6;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start +
             pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58," ");
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_90._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_e0 = (undefined4 *)((ulong)local_e0 & 0xffffffffffffff00);
  local_e8 = &PTR__lazy_ostream_013ae148;
  local_d8._M_impl.super__Vector_impl_data._M_start = boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_60;
  local_90._0_8_ = " ";
  local_b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b0._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_b8 = &PTR__lazy_ostream_013ae818;
  local_b0._M_impl.super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage = local_90;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_60 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_180,1,2,REQUIRE,0xf10899,(size_t)(local_90 + 8),0x1a6,&local_e8,
             "\"\\x20\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  base2.m_base_data = '\x11';
  Base::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base2,&pstream);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1aa;
  file_01.m_begin = (iterator)&local_1c0;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d0,
             msg_01);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_90._0_4_ = 0x20;
  local_58._M_dataplus._M_p._0_1_ = base2.m_base_data == ' ';
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_78.m_message.px = (element_type *)0xf10351;
  local_e0 = (undefined4 *)((ulong)local_e0 & 0xffffffffffffff00);
  local_e8 = &PTR__lazy_ostream_013aee50;
  local_d8._M_impl.super__Vector_impl_data._M_start = boost::unit_test::lazy_ostream::inst;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  local_b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b0._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_b8 = &PTR__lazy_ostream_013ae248;
  local_b0._M_impl.super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_60;
  local_d8._M_impl.super__Vector_impl_data._M_finish = local_90 + 8;
  local_90._8_8_ = &base2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_180,1,2,REQUIRE,0xf10871,(size_t)&local_78,0x1aa,
             &local_e8,"0x20",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &pstream.m_substream.m_substream.m_substream);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_move)
{
    UncopyableStream stream{MakeByteSpan(std::string_view{"abc"})};
    ParamsStream pstream{std::move(stream), RAW, HEX, RAW};
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "abc");
    pstream.GetStream().clear();

    Base base1{0x20};
    pstream << base1;
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "\x20");

    Base base2;
    pstream >> base2;
    BOOST_CHECK_EQUAL(base2.m_base_data, 0x20);
}